

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O0

TArray<char,_char> __thiscall SoundDecoder::readAll(SoundDecoder *this)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  undefined8 extraout_RDX;
  long *in_RSI;
  TArray<char,_char> TVar4;
  undefined4 local_20;
  uint got;
  uint total;
  SoundDecoder *this_local;
  TArray<char,_char> *output;
  
  TArray<char,_char>::TArray((TArray<char,_char> *)this);
  local_20 = 0;
  TArray<char,_char>::Resize((TArray<char,_char> *)this,0x8000);
  while( true ) {
    pcVar3 = TArray<char,_char>::operator[]((TArray<char,_char> *)this,(ulong)local_20);
    uVar1 = TArray<char,_char>::Size((TArray<char,_char> *)this);
    iVar2 = (**(code **)(*in_RSI + 8))(in_RSI,pcVar3,uVar1 - local_20);
    if (iVar2 == 0) break;
    local_20 = local_20 + iVar2;
    TArray<char,_char>::Resize((TArray<char,_char> *)this,local_20 * 2);
  }
  TArray<char,_char>::Resize((TArray<char,_char> *)this,local_20);
  TVar4.Most = (int)extraout_RDX;
  TVar4.Count = (int)((ulong)extraout_RDX >> 0x20);
  TVar4.Array = (char *)this;
  return TVar4;
}

Assistant:

TArray<char> SoundDecoder::readAll()
{
    TArray<char> output;
    unsigned total = 0;
    unsigned got;

    output.Resize(total+32768);
    while((got=(unsigned)read(&output[total], output.Size()-total)) > 0)
    {
        total += got;
        output.Resize(total*2);
    }
    output.Resize(total);
    return output;
}